

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

char * Scl_LibertyReadPinFormula(Scl_Tree_t *p,Scl_Item_t *pPin)

{
  int iVar1;
  char *pcVar2;
  Scl_Item_t *local_28;
  Scl_Item_t *pFunc;
  Scl_Item_t *pPin_local;
  Scl_Tree_t *p_local;
  
  local_28 = Scl_LibertyItem(p,pPin->Child);
  while( true ) {
    if (local_28 == (Scl_Item_t *)0x0) {
      return (char *)0x0;
    }
    iVar1 = Scl_LibertyCompare(p,local_28->Key,"function");
    if (iVar1 == 0) break;
    local_28 = Scl_LibertyItem(p,local_28->Next);
  }
  pcVar2 = Scl_LibertyReadString(p,local_28->Head);
  return pcVar2;
}

Assistant:

char * Scl_LibertyReadPinFormula( Scl_Tree_t * p, Scl_Item_t * pPin )
{
    Scl_Item_t * pFunc;
    Scl_ItemForEachChildName( p, pPin, pFunc, "function" )
        return Scl_LibertyReadString(p, pFunc->Head);
    return NULL;
}